

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rsa.c
# Opt level: O2

int mbedtls_rsa_pkcs1_sign
              (mbedtls_rsa_context *ctx,_func_int_void_ptr_uchar_ptr_size_t *f_rng,void *p_rng,
              int mode,mbedtls_md_type_t md_alg,uint hashlen,uchar *hash,uchar *sig)

{
  ulong __n;
  ulong uVar1;
  byte bVar2;
  int iVar3;
  mbedtls_md_info_t *pmVar4;
  ulong uVar5;
  size_t sVar6;
  size_t __n_00;
  long lVar7;
  uchar *input;
  long lVar8;
  mbedtls_md_context_t mStackY_b0;
  mbedtls_mpi *pmStackY_98;
  size_t sStackY_90;
  void *pvStackY_88;
  ulong uStackY_80;
  uchar auStackY_78 [72];
  
  if (ctx->padding != 1) {
    if (ctx->padding == 0) {
      iVar3 = mbedtls_rsa_rsassa_pkcs1_v15_sign(ctx,f_rng,p_rng,mode,md_alg,hashlen,hash,sig);
      return iVar3;
    }
    return -0x4100;
  }
  if (mode == 1) {
    if (f_rng == (_func_int_void_ptr_uchar_ptr_size_t *)0x0) {
      return -0x4080;
    }
    if (ctx->padding != 1) {
      return -0x4080;
    }
LAB_0010eb58:
    __n = ctx->len;
    if (md_alg != MBEDTLS_MD_NONE) {
      pmVar4 = mbedtls_md_info_from_type(md_alg);
      if (pmVar4 == (mbedtls_md_info_t *)0x0) goto LAB_0010ec06;
      bVar2 = mbedtls_md_get_size(pmVar4);
      hashlen = (uint)bVar2;
    }
    pmVar4 = mbedtls_md_info_from_type(ctx->hash_id);
    iVar3 = -0x4080;
    if (pmVar4 != (mbedtls_md_info_t *)0x0) {
      bVar2 = mbedtls_md_get_size(pmVar4);
      uStackY_80 = (ulong)bVar2;
      if ((uint)bVar2 + (uint)bVar2 <= __n) {
        lVar8 = __n - uStackY_80;
        __n_00 = lVar8 - 2;
        if ((ulong)((uint)bVar2 + (uint)bVar2) + 2 <= __n) {
          __n_00 = uStackY_80;
        }
        memset(sig,0,__n);
        iVar3 = (*f_rng)(p_rng,auStackY_78,__n_00);
        if (iVar3 == 0) {
          pmStackY_98 = &ctx->N;
          pvStackY_88 = p_rng;
          sStackY_90 = mbedtls_mpi_bitlen(pmStackY_98);
          lVar7 = lVar8 - __n_00;
          sig[lVar7 + -2] = '\x01';
          memcpy(sig + lVar7 + -1,auStackY_78,__n_00);
          mbedtls_md_init(&mStackY_b0);
          iVar3 = mbedtls_md_setup(&mStackY_b0,pmVar4,0);
          if ((iVar3 == 0) && (iVar3 = mbedtls_md_starts(&mStackY_b0), iVar3 == 0)) {
            input = sig + __n_00 + lVar7 + -1;
            iVar3 = mbedtls_md_update(&mStackY_b0,input,8);
            if (((iVar3 == 0) &&
                (((iVar3 = mbedtls_md_update(&mStackY_b0,hash,(ulong)hashlen), iVar3 == 0 &&
                  (iVar3 = mbedtls_md_update(&mStackY_b0,auStackY_78,__n_00), iVar3 == 0)) &&
                 (iVar3 = mbedtls_md_finish(&mStackY_b0,input), uVar1 = uStackY_80, iVar3 == 0))))
               && (uVar5 = (ulong)((sStackY_90 + 7 & 7) == 0),
                  iVar3 = mgf_mask(sig + uVar5,lVar8 + ~uVar5,input,uStackY_80,&mStackY_b0),
                  iVar3 == 0)) {
              sVar6 = mbedtls_mpi_bitlen(pmStackY_98);
              *sig = *sig & (byte)(0xff >> (((char)__n * '\b' + '\x01') - (char)sVar6 & 0x1fU));
              input[uVar1] = 0xbc;
              mbedtls_platform_zeroize(auStackY_78,0x40);
              iVar3 = 0;
            }
          }
          mbedtls_md_free(&mStackY_b0);
          if (iVar3 == 0) {
            if (mode == 0) {
              iVar3 = mbedtls_rsa_public(ctx,sig,sig);
            }
            else {
              iVar3 = mbedtls_rsa_private(ctx,f_rng,pvStackY_88,sig,sig);
            }
          }
        }
        else {
          iVar3 = iVar3 + -0x4480;
        }
      }
    }
  }
  else {
    if (f_rng != (_func_int_void_ptr_uchar_ptr_size_t *)0x0) goto LAB_0010eb58;
LAB_0010ec06:
    iVar3 = -0x4080;
  }
  return iVar3;
}

Assistant:

int mbedtls_rsa_pkcs1_sign( mbedtls_rsa_context *ctx,
                    int (*f_rng)(void *, unsigned char *, size_t),
                    void *p_rng,
                    int mode,
                    mbedtls_md_type_t md_alg,
                    unsigned int hashlen,
                    const unsigned char *hash,
                    unsigned char *sig )
{
    RSA_VALIDATE_RET( ctx != NULL );
    RSA_VALIDATE_RET( mode == MBEDTLS_RSA_PRIVATE ||
                      mode == MBEDTLS_RSA_PUBLIC );
    RSA_VALIDATE_RET( ( md_alg  == MBEDTLS_MD_NONE &&
                        hashlen == 0 ) ||
                      hash != NULL );
    RSA_VALIDATE_RET( sig != NULL );

    switch( ctx->padding )
    {
#if defined(MBEDTLS_PKCS1_V15)
        case MBEDTLS_RSA_PKCS_V15:
            return mbedtls_rsa_rsassa_pkcs1_v15_sign( ctx, f_rng, p_rng, mode, md_alg,
                                              hashlen, hash, sig );
#endif

#if defined(MBEDTLS_PKCS1_V21)
        case MBEDTLS_RSA_PKCS_V21:
            return mbedtls_rsa_rsassa_pss_sign( ctx, f_rng, p_rng, mode, md_alg,
                                        hashlen, hash, sig );
#endif

        default:
            return( MBEDTLS_ERR_RSA_INVALID_PADDING );
    }
}